

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::NameResolver::OnBrTableExpr(NameResolver *this,BrTableExpr *expr)

{
  bool bVar1;
  reference var;
  Var *target;
  iterator __end1;
  iterator __begin1;
  VarVector *__range1;
  BrTableExpr *expr_local;
  NameResolver *this_local;
  
  __end1 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::begin(&expr->targets);
  target = (Var *)std::vector<wabt::Var,_std::allocator<wabt::Var>_>::end(&expr->targets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                                *)&target);
    if (!bVar1) break;
    var = __gnu_cxx::
          __normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
          operator*(&__end1);
    ResolveLabelVar(this,var);
    __gnu_cxx::__normal_iterator<wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
    operator++(&__end1);
  }
  ResolveLabelVar(this,&expr->default_target);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameResolver::OnBrTableExpr(BrTableExpr* expr) {
  for (Var& target : expr->targets)
    ResolveLabelVar(&target);
  ResolveLabelVar(&expr->default_target);
  return Result::Ok;
}